

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

uint vkt::pipeline::anon_unknown_0::getSwizzledComp<unsigned_int>
               (Vector<unsigned_int,_4> *vec,VkComponentSwizzle comp,int identityNdx)

{
  uint *puVar1;
  int identityNdx_local;
  VkComponentSwizzle comp_local;
  Vector<unsigned_int,_4> *vec_local;
  
  if (comp == VK_COMPONENT_SWIZZLE_IDENTITY) {
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](vec,identityNdx);
    vec_local._4_4_ = *puVar1;
  }
  else if (comp == VK_COMPONENT_SWIZZLE_ZERO) {
    vec_local._4_4_ = 0;
  }
  else if (comp == VK_COMPONENT_SWIZZLE_ONE) {
    vec_local._4_4_ = 1;
  }
  else {
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](vec,comp - VK_COMPONENT_SWIZZLE_R);
    vec_local._4_4_ = *puVar1;
  }
  return vec_local._4_4_;
}

Assistant:

ScalarType getSwizzledComp (const tcu::Vector<ScalarType, 4>& vec, vk::VkComponentSwizzle comp, int identityNdx)
{
	if (comp == vk::VK_COMPONENT_SWIZZLE_IDENTITY)
		return vec[identityNdx];
	else if (comp == vk::VK_COMPONENT_SWIZZLE_ZERO)
		return ScalarType(0);
	else if (comp == vk::VK_COMPONENT_SWIZZLE_ONE)
		return ScalarType(1);
	else
		return vec[comp - vk::VK_COMPONENT_SWIZZLE_R];
}